

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

bool __thiscall Func::ShouldDoLazyBailOut(Func *this)

{
  bool bVar1;
  BOOL BVar2;
  JITTimeFunctionBody *this_00;
  Func *this_local;
  
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eb5b30,LazyBailoutPhase);
  if (bVar1) {
    this_00 = GetJITFunctionBody(this);
    bVar1 = JITTimeFunctionBody::IsAsmJsMode(this_00);
    if (((!bVar1) && (BVar2 = HasTry(this), BVar2 == 0)) && (bVar1 = IsLoopBody(this), !bVar1)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
Func::ShouldDoLazyBailOut() const
{
#if defined(_M_X64)
    if (!PHASE_ON1(Js::LazyBailoutPhase) ||
        this->GetJITFunctionBody()->IsAsmJsMode() || // don't have bailouts in asm.js
        this->HasTry() ||                            // lazy bailout in function with try/catch not supported for now
                                                     // `EHBailoutPatchUp` set a `hasBailedOut` bit to rethrow the exception in the interpreter
                                                     // if the instruction has ANY bailout. In the future, to implement lazy bailout with try/catch,
                                                     // we would need to change how this bit is generated.
        this->IsLoopBody())                          // don't do lazy bailout on jit'd loop body either
    {
        return false;
    }

    return true;
#else
    return false;
#endif
}